

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

void __thiscall
icu_63::NumeratorSubstitution::NumeratorSubstitution
          (NumeratorSubstitution *this,int32_t _pos,double _denominator,NFRuleSet *_ruleSet,
          UnicodeString *description,UErrorCode *status)

{
  UErrorCode *this_00;
  UBool UVar1;
  int64_t iVar2;
  ConstChar16Ptr local_90 [3];
  UnicodeString local_78;
  UErrorCode *local_38;
  UErrorCode *status_local;
  UnicodeString *description_local;
  NFRuleSet *_ruleSet_local;
  double _denominator_local;
  NumeratorSubstitution *pNStack_10;
  int32_t _pos_local;
  NumeratorSubstitution *this_local;
  
  local_38 = status;
  status_local = (UErrorCode *)description;
  description_local = (UnicodeString *)_ruleSet;
  _ruleSet_local = (NFRuleSet *)_denominator;
  _denominator_local._4_4_ = _pos;
  pNStack_10 = this;
  fixdesc(&local_78,description);
  NFSubstitution::NFSubstitution(&this->super_NFSubstitution,_pos,_ruleSet,&local_78,local_38);
  UnicodeString::~UnicodeString(&local_78);
  (this->super_NFSubstitution).super_UObject._vptr_UObject =
       (_func_int **)&PTR__NumeratorSubstitution_004f0080;
  this->denominator = (double)_ruleSet_local;
  iVar2 = util64_fromDouble(this->denominator);
  this_00 = status_local;
  this->ldenominator = iVar2;
  ConstChar16Ptr::ConstChar16Ptr
            (local_90,
             L"<<㙎捩彵㌶ㄲ慓敭慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟ㄳ临卆扵瑳瑩瑵潩䕮一椶畣㙟㈳䴲汵楴汰敩卲扵瑳瑩瑵潩䕮一椶畣㙟ㄳ䴹摯汵獵畓獢楴畴楴湯E㙎捩彵㌶㐲湉整牧污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㘲牆捡楴湯污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㔲扁潳畬整慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟㈳丱浵牥瑡牯畓獢楴畴楴湯E況￫泛￫洅￫洟￫濹￫瀂￫瀂￫瀂￫瀂￫瀂￫濰￫濧￫濞￫濕￫濌￫濃￫澺￫澱￫澨￫癓￫癦￫癦￫皃￫皖￫皴￫盏￫盪￫眅￫眠￫狏￫珬￫琳￫瑰￫璤￫瓠￫甜￫畘￫疔￫痍￫㙎捩彵㌶渶浵敢㑲浩汰㌱潔敫䍮湯畳敭䕲一椶畣㙟㘳畮扭牥椴灭ㅬ匴浹潢偬潲楶敤䕲"
            );
  UVar1 = UnicodeString::endsWith((UnicodeString *)this_00,local_90,2);
  this->withZeros = UVar1;
  ConstChar16Ptr::~ConstChar16Ptr(local_90);
  return;
}

Assistant:

NumeratorSubstitution(int32_t _pos,
        double _denominator,
        NFRuleSet* _ruleSet,
        const UnicodeString& description,
        UErrorCode& status)
        : NFSubstitution(_pos, _ruleSet, fixdesc(description), status), denominator(_denominator) 
    {
        ldenominator = util64_fromDouble(denominator);
        withZeros = description.endsWith(LTLT, 2);
    }